

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::
elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
::format(elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
         *this,log_msg *msg,tm *param_2,memory_buf_t *dest)

{
  ulong uVar1;
  uint32_or_64_or_128_t<unsigned_long> n;
  ulong value;
  long lVar2;
  format_decimal_result<char_*> fVar3;
  scoped_padder p;
  scoped_padder local_60;
  char local_38 [21];
  char acStack_23 [3];
  char *local_20;
  
  lVar2 = (msg->time).__d.__r;
  uVar1 = lVar2 - (this->last_message_time_).__d.__r;
  value = 0;
  if (0 < (long)uVar1) {
    value = uVar1;
  }
  (this->last_message_time_).__d.__r = lVar2;
  lVar2 = 0x3f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
    }
  }
  scoped_padder::scoped_padder
            (&local_60,
             (ulong)((uint)(byte)::fmt::v9::detail::do_count_digits(unsigned_long)::bsr2log10[lVar2]
                    - (uint)(value < *(ulong *)(::fmt::v9::detail::do_count_digits(unsigned_long)::
                                                zero_or_powers_of_10 +
                                               (ulong)(byte)::fmt::v9::detail::
                                                            do_count_digits(unsigned_long)::
                                                            bsr2log10[lVar2] * 8))),
             &(this->super_flag_formatter).padinfo_,dest);
  fVar3 = ::fmt::v9::detail::format_decimal<char,unsigned_long>(local_38,value,0x15);
  local_20 = fVar3.begin;
  lVar2 = (long)local_38 - (long)local_20;
  if (-0x16 < lVar2) {
    ::fmt::v9::detail::buffer<char>::append<char>
              (&dest->super_buffer<char>,local_20,local_20 + lVar2 + 0x15);
    scoped_padder::~scoped_padder(&local_60);
    return;
  }
  ::fmt::v9::detail::assert_fail
            ("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/core.h"
             ,0x199,"negative value");
}

Assistant:

SPDLOG_INLINE std::unique_ptr<formatter> pattern_formatter::clone() const {
    custom_flags cloned_custom_formatters;
    for (auto &it : custom_handlers_) {
        cloned_custom_formatters[it.first] = it.second->clone();
    }
    auto cloned = details::make_unique<pattern_formatter>(pattern_, pattern_time_type_, eol_,
                                                          std::move(cloned_custom_formatters));
    cloned->need_localtime(need_localtime_);
#if defined(__GNUC__) && __GNUC__ < 5
    return std::move(cloned);
#else
    return cloned;
#endif
}